

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O0

BOOL __thiscall
Js::CrossSiteObject<Js::SpreadArgument>::SetProperty
          (CrossSiteObject<Js::SpreadArgument> *this,JavascriptString *propertyNameString,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  BOOL BVar1;
  ScriptContext *scriptContext;
  Var value_00;
  PropertyValueInfo *info_local;
  PropertyOperationFlags flags_local;
  Var value_local;
  JavascriptString *propertyNameString_local;
  CrossSiteObject<Js::SpreadArgument> *this_local;
  
  scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  value_00 = CrossSite::MarshalVar(scriptContext,value,false);
  BVar1 = SpreadArgument::SetProperty
                    (&this->super_SpreadArgument,propertyNameString,value_00,flags,info);
  return BVar1;
}

Assistant:

BOOL CrossSiteObject<T>::SetProperty(JavascriptString* propertyNameString, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        value = CrossSite::MarshalVar(this->GetScriptContext(), value);
        return __super::SetProperty(propertyNameString, value, flags, info);
    }